

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blackboard.h
# Opt level: O0

size_t __thiscall cali::Blackboard::find_existing_entry(Blackboard *this,cali_id_t key)

{
  bool bVar1;
  size_t local_20;
  size_t I;
  cali_id_t key_local;
  Blackboard *this_local;
  
  local_20 = key % 0x3fd;
  while( true ) {
    bVar1 = false;
    if (this->hashtable[local_20].key != key) {
      bVar1 = this->hashtable[local_20].key != 0xffffffffffffffff;
    }
    if (!bVar1) break;
    local_20 = (local_20 + 1) % 0x3fd;
  }
  return local_20;
}

Assistant:

inline size_t find_existing_entry(cali_id_t key) const
    {
        size_t I = key % Nmax;

        while (hashtable[I].key != key && hashtable[I].key != CALI_INV_ID)
            I = (I + 1) % Nmax;

        return I;
    }